

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

Unr_Man_t * Unr_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Unr_Man_t *pUVar2;
  Vec_Int_t *pVVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  Unr_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pUVar2 = (Unr_Man_t *)calloc(1,0x68);
  pUVar2->pGia = pGia;
  iVar1 = Gia_ManObjNum(pGia);
  pUVar2->nObjs = iVar1;
  pVVar3 = Vec_IntAlloc(pUVar2->nObjs);
  pUVar2->vOrder = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pUVar2->vOrderLim = pVVar3;
  pVVar3 = Vec_IntStartFull(pUVar2->nObjs);
  pUVar2->vTents = pVVar3;
  pVVar3 = Vec_IntStart(pUVar2->nObjs);
  pUVar2->vRanks = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pUVar2->vObjLim = pVVar3;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar3 = Vec_IntAlloc(iVar1);
  pUVar2->vCiMap = pVVar3;
  iVar1 = Gia_ManCoNum(pGia);
  pVVar3 = Vec_IntAlloc(iVar1);
  pUVar2->vCoMap = pVVar3;
  pVVar3 = Vec_IntAlloc(10000);
  pUVar2->vPiLits = pVVar3;
  pGVar4 = Gia_ManStart(10000);
  pUVar2->pFrames = pGVar4;
  pcVar5 = Abc_UtilStrsav(pGia->pName);
  pUVar2->pFrames->pName = pcVar5;
  Gia_ManHashStart(pUVar2->pFrames);
  return pUVar2;
}

Assistant:

Unr_Man_t * Unr_ManAlloc( Gia_Man_t * pGia )
{
    Unr_Man_t * p;
    p = ABC_CALLOC( Unr_Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum(pGia);
    p->vOrder    = Vec_IntAlloc( p->nObjs );
    p->vOrderLim = Vec_IntAlloc( 100 );
    p->vTents    = Vec_IntStartFull( p->nObjs );
    p->vRanks    = Vec_IntStart( p->nObjs );
    p->vObjLim   = Vec_IntAlloc( 100 );
    p->vCiMap    = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCoMap    = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->vPiLits   = Vec_IntAlloc( 10000 );
    p->pFrames   = Gia_ManStart( 10000 );
    p->pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( p->pFrames );
    return p;
}